

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O2

void auto_commit_space_used_test(void)

{
  fdb_status fVar1;
  char *__format;
  int iVar2;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  char fname [32];
  fdb_kvs_config local_248;
  timeval __test_begin;
  fdb_file_info finfo;
  fdb_config local_128;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  func_test* > errorlog.txt");
  fdb_get_default_config();
  local_128.buffercache_size = 0;
  local_128.auto_commit = true;
  fdb_get_default_config();
  memcpy(&local_128,&finfo,0xf8);
  fdb_get_default_kvs_config();
  iVar2 = -4;
  while( true ) {
    if (iVar2 == 0) {
      fdb_shutdown();
      memleak_end();
      __format = "%s PASSED\n";
      if (auto_commit_space_used_test()::__test_pass != '\0') {
        __format = "%s FAILED\n";
      }
      fprintf(_stderr,__format,"auto_commit space used on close test");
      return;
    }
    builtin_strncpy(fname + 8,"est1",5);
    builtin_strncpy(fname,"./func_t",8);
    fVar1 = fdb_open(&dbfile,fname,&local_128);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xf23);
      auto_commit_space_used_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xf23,"void auto_commit_space_used_test()");
    }
    fVar1 = fdb_kvs_open(dbfile,&db,"justonekv",&local_248);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xf25);
      auto_commit_space_used_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xf25,"void auto_commit_space_used_test()");
    }
    fVar1 = fdb_get_file_info(dbfile,&finfo);
    if (fVar1 != FDB_RESULT_SUCCESS) break;
    if (finfo.file_size != local_128.blocksize * 7) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xf2c);
      auto_commit_space_used_test()::__test_pass = '\x01';
      if (finfo.file_size != local_128.blocksize * 7) {
        __assert_fail("finfo.file_size == fconfig.blocksize * 7",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0xf2c,"void auto_commit_space_used_test()");
      }
    }
    fVar1 = fdb_close(dbfile);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0xf2f);
      auto_commit_space_used_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0xf2f,"void auto_commit_space_used_test()");
    }
    iVar2 = iVar2 + 1;
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
          ,0xf29);
  auto_commit_space_used_test()::__test_pass = 1;
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0xf29,"void auto_commit_space_used_test()");
}

Assistant:

void auto_commit_space_used_test()
{
    TEST_INIT();

    memleak_start();

    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_status status;
    fdb_config fconfig;
    fdb_kvs_config kvs_config;
    int ntimes = 4;
    int i;
    char fname[32];

    // remove previous func_test test files
    int r = system(SHELL_DEL" func_test* > errorlog.txt");
    (void)r;

    fconfig = fdb_get_default_config();
    fconfig.buffercache_size= 0;
    fconfig.auto_commit = true;

    fconfig = fdb_get_default_config();
    kvs_config = fdb_get_default_kvs_config();

    for (i = ntimes; i; --i) {
        sprintf(fname, "./func_test1");
        status = fdb_open(&dbfile, fname, &fconfig);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_kvs_open(dbfile, &db, "justonekv", &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        fdb_file_info finfo;
        status = fdb_get_file_info(dbfile, &finfo);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        // Since V3 magic number, 7 blocks are used:
        // 4 superblocks + KV name header + Stale-tree root node + DB header
        TEST_CHK(finfo.file_size == fconfig.blocksize * 7);

        status = fdb_close(dbfile);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    fdb_shutdown();

    memleak_end();
    TEST_RESULT("auto_commit space used on close test");
}